

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O1

void __thiscall
solitaire::piles::FoundationPileWithAceTest_tryAddCardWithDifferentSuitThanOnTopOfPile_Test::
TestBody(FoundationPileWithAceTest_tryAddCardWithDifferentSuitThanOnTopOfPile_Test *this)

{
  element_type *peVar1;
  void *pvVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Card cardWithDifferentSuitThanOnTopOfPile;
  optional<solitaire::cards::Card> cardToAdd;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  pointer local_80;
  AssertHelper local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_68;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_50;
  _Storage<solitaire::cards::Card,_true> local_38;
  _Storage<solitaire::cards::Card,_true> local_30;
  undefined1 local_28;
  
  solitaire::cards::Card::Card(&local_38._M_value,Two,Spade);
  local_30 = local_38;
  local_28 = 1;
  peVar1 = (this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.pile.
           super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_FoundationPile).super_Archiver._vptr_Archiver[4])(peVar1,&local_30);
  testing::internal::CmpHelperEQ<std::optional<solitaire::cards::Card>,solitaire::cards::Card>
            ((internal *)local_90,"cardToAdd","cardWithDifferentSuitThanOnTopOfPile",
             (optional<solitaire::cards::Card> *)&local_30._M_value,&local_38._M_value);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_68.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_68.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_90,
             &(this->super_FoundationPileWithAceTest).pileCards);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_50,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_90);
  pvVar2 = (void *)CONCAT71(local_90._1_7_,local_90[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_80 - (long)pvVar2);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_90,
             &local_50);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_68,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_90);
  pvVar2 = (void *)CONCAT71(local_90._1_7_,local_90[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_80 - (long)pvVar2);
  }
  (*(((this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&local_78,(char *)&local_68,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  if (local_68.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_78.data_ == '\0') {
    testing::Message::Message((Message *)local_90);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)CONCAT71(local_90._1_7_,local_90[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_90._1_7_,local_90[0]) + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST_F(FoundationPileWithAceTest,
       tryAddCardWithDifferentSuitThanOnTopOfPile)
{
    const Card cardWithDifferentSuitThanOnTopOfPile {Value::Two, Suit::Spade};
    std::optional<Card> cardToAdd = cardWithDifferentSuitThanOnTopOfPile;

    pile->tryAddCard(cardToAdd);

    EXPECT_EQ(cardToAdd, cardWithDifferentSuitThanOnTopOfPile);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}